

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O0

void __thiscall
amrex::FaceLinear::interp_face
          (FaceLinear *this,FArrayBox *crse,int crse_comp,FArrayBox *fine,int fine_comp,int ncomp,
          Box *fine_region,IntVect *ratio,IArrayBox *solve_mask,Geometry *param_10,
          Geometry *param_11,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *param_12,
          int param_13,RunOn runon)

{
  bool bVar1;
  CellIndex CVar2;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  int in_R8D;
  undefined4 in_R9D;
  Box *in_stack_00000008;
  undefined8 *in_stack_00000010;
  BaseFab<int> *in_stack_00000018;
  Array4<const_int> mask_arr;
  Array4<const_double> *crse_arr;
  Array4<double> *fine_arr;
  undefined4 in_stack_fffffffffffff798;
  undefined4 in_stack_fffffffffffff79c;
  undefined8 in_stack_fffffffffffff7a0;
  Box *pBVar3;
  int ncomp_00;
  undefined4 in_stack_fffffffffffff7a8;
  undefined4 in_stack_fffffffffffff7ac;
  undefined1 local_840 [64];
  undefined8 local_800;
  undefined4 local_7f8;
  undefined1 local_7f0 [64];
  undefined8 local_7b0;
  undefined4 local_7a8;
  undefined1 local_7a0 [64];
  undefined8 local_760;
  undefined4 local_758;
  undefined1 local_750 [64];
  undefined1 auStack_710 [64];
  undefined1 auStack_6d0 [64];
  undefined8 local_690;
  undefined4 local_688;
  undefined1 local_680 [64];
  undefined1 auStack_640 [64];
  undefined1 auStack_600 [64];
  undefined8 local_5c0;
  undefined4 local_5b8;
  undefined1 local_5b0 [64];
  undefined1 auStack_570 [64];
  undefined1 auStack_530 [64];
  undefined8 local_4f0;
  undefined4 local_4e8;
  Array4<const_int> local_4e0;
  Array4<const_int> local_4a0;
  Array4<const_double> local_460;
  Array4<const_double> *local_420;
  Array4<double> local_418;
  Array4<double> *local_3d8;
  undefined4 local_3d0;
  int local_3bc;
  long local_3b8;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  Array4<double> local_378;
  int local_334;
  Array4<const_double> local_328;
  int local_2e4;
  long local_2e0;
  BaseFab<int> *local_2d8;
  Dim3 local_2d0;
  Dim3 local_2bc;
  Dim3 local_2b0;
  Dim3 local_2a0;
  int local_294;
  undefined8 *local_290;
  double *local_288;
  Dim3 local_280;
  undefined8 *local_270;
  undefined4 local_268;
  undefined4 uStack_264;
  int local_260;
  undefined4 local_25c;
  undefined8 *local_258;
  undefined4 local_24c;
  undefined8 *local_248;
  undefined4 local_23c;
  undefined8 *local_238;
  Dim3 local_230;
  undefined8 *local_220;
  int local_218;
  int iStack_214;
  int local_210;
  undefined4 local_20c;
  long local_208;
  undefined4 local_1fc;
  long local_1f8;
  undefined4 local_1ec;
  int *local_1e8;
  Dim3 local_1e0;
  Dim3 local_1d0;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  undefined8 *local_1a0;
  double *local_198;
  Dim3 local_190;
  undefined8 *local_180;
  undefined4 local_178;
  undefined4 uStack_174;
  int local_170;
  undefined4 local_16c;
  undefined8 *local_168;
  undefined4 local_15c;
  undefined8 *local_158;
  undefined4 local_14c;
  undefined8 *local_148;
  Dim3 local_140;
  undefined8 *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  int *local_f8;
  Dim3 local_f0;
  Dim3 local_dc;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  int *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  ncomp_00 = (int)((ulong)in_stack_fffffffffffff7a0 >> 0x20);
  local_198 = *(double **)(in_RCX + 0x10);
  local_1a0 = (undefined8 *)(in_RCX + 0x18);
  local_1a4 = *(int *)(in_RCX + 0x34);
  local_14c = 0;
  local_178 = *(undefined4 *)local_1a0;
  local_15c = 1;
  uStack_174 = *(undefined4 *)(in_RCX + 0x1c);
  local_1c0._0_8_ = *local_1a0;
  local_16c = 2;
  local_1c0.z = *(int *)(in_RCX + 0x20);
  local_f8 = (int *)(in_RCX + 0x24);
  local_fc = 0;
  local_128 = *local_f8 + 1;
  local_108 = in_RCX + 0x24;
  local_10c = 1;
  iStack_124 = *(int *)(in_RCX + 0x28) + 1;
  local_118 = in_RCX + 0x24;
  local_11c = 2;
  local_1e0.z = *(int *)(in_RCX + 0x2c) + 1;
  local_1e0.y = iStack_124;
  local_1e0.x = local_128;
  local_3d0 = in_R9D;
  local_3bc = in_EDX;
  local_3b8 = in_RSI;
  local_334 = in_R8D;
  local_1d0._0_8_ = local_1e0._0_8_;
  local_1d0.z = local_1e0.z;
  local_1b0._0_8_ = local_1c0._0_8_;
  local_1b0.z = local_1c0.z;
  local_190._0_8_ = local_1c0._0_8_;
  local_190.z = local_1c0.z;
  local_180 = local_1a0;
  local_170 = local_1c0.z;
  local_168 = local_1a0;
  local_158 = local_1a0;
  local_148 = local_1a0;
  local_140._0_8_ = local_1e0._0_8_;
  local_140.z = local_1e0.z;
  local_130 = local_1a0;
  local_120 = local_1e0.z;
  Array4<double>::Array4(&local_378,local_198,&local_1b0,&local_1d0,local_1a4);
  Array4<double>::Array4<double,_0>(&local_418,&local_378,local_334);
  local_2e0 = local_3b8;
  local_2e4 = local_3bc;
  local_288 = *(double **)(local_3b8 + 0x10);
  local_290 = (undefined8 *)(local_3b8 + 0x18);
  local_294 = *(int *)(local_3b8 + 0x34);
  local_23c = 0;
  local_268 = *(undefined4 *)local_290;
  local_24c = 1;
  uStack_264 = *(undefined4 *)(local_3b8 + 0x1c);
  local_2b0._0_8_ = *local_290;
  local_25c = 2;
  local_2b0.z = *(int *)(local_3b8 + 0x20);
  local_1e8 = (int *)(local_3b8 + 0x24);
  local_1ec = 0;
  local_218 = *local_1e8 + 1;
  local_1f8 = local_3b8 + 0x24;
  local_1fc = 1;
  iStack_214 = *(int *)(local_3b8 + 0x28) + 1;
  local_208 = local_3b8 + 0x24;
  local_20c = 2;
  local_2d0.z = *(int *)(local_3b8 + 0x2c) + 1;
  local_2d0.y = iStack_214;
  local_2d0.x = local_218;
  local_3d8 = &local_418;
  local_2bc._0_8_ = local_2d0._0_8_;
  local_2bc.z = local_2d0.z;
  local_2a0._0_8_ = local_2b0._0_8_;
  local_2a0.z = local_2b0.z;
  local_280._0_8_ = local_2b0._0_8_;
  local_280.z = local_2b0.z;
  local_270 = local_290;
  local_260 = local_2b0.z;
  local_258 = local_290;
  local_248 = local_290;
  local_238 = local_290;
  local_230._0_8_ = local_2d0._0_8_;
  local_230.z = local_2d0.z;
  local_220 = local_290;
  local_210 = local_2d0.z;
  Array4<const_double>::Array4(&local_328,local_288,&local_2a0,&local_2bc,local_294);
  Array4<const_double>::Array4<const_double,_0>(&local_460,&local_328,local_2e4);
  local_420 = &local_460;
  Array4<const_int>::Array4(&local_4a0);
  bVar1 = BaseFab<int>::isAllocated(in_stack_00000018);
  if (bVar1) {
    local_2d8 = in_stack_00000018;
    local_a8 = in_stack_00000018->dptr;
    local_b0 = &in_stack_00000018->domain;
    local_b4 = in_stack_00000018->nvar;
    local_5c = 0;
    local_88 = (local_b0->smallend).vect[0];
    local_6c = 1;
    iStack_84 = (in_stack_00000018->domain).smallend.vect[1];
    local_d0.x = (local_b0->smallend).vect[0];
    local_d0.y = (local_b0->smallend).vect[1];
    local_7c = 2;
    local_d0.z = (in_stack_00000018->domain).smallend.vect[2];
    local_8 = &(in_stack_00000018->domain).bigend;
    local_c = 0;
    local_38 = local_8->vect[0] + 1;
    local_18 = &(in_stack_00000018->domain).bigend;
    local_1c = 1;
    iStack_34 = (in_stack_00000018->domain).bigend.vect[1] + 1;
    local_28 = &(in_stack_00000018->domain).bigend;
    local_2c = 2;
    local_f0.z = (in_stack_00000018->domain).bigend.vect[2] + 1;
    local_f0.y = iStack_34;
    local_f0.x = local_38;
    local_dc._0_8_ = local_f0._0_8_;
    local_dc.z = local_f0.z;
    local_c0._0_8_ = local_d0._0_8_;
    local_c0.z = local_d0.z;
    local_a0._0_8_ = local_d0._0_8_;
    local_a0.z = local_d0.z;
    local_90 = local_b0;
    local_80 = local_d0.z;
    local_78 = local_b0;
    local_68 = local_b0;
    local_58 = local_b0;
    local_50._0_8_ = local_f0._0_8_;
    local_50.z = local_f0.z;
    local_40 = local_b0;
    local_30 = local_f0.z;
    Array4<const_int>::Array4(&local_4e0,local_a8,&local_c0,&local_dc,local_b4);
    memcpy(&local_4a0,&local_4e0,0x3c);
  }
  CVar2 = Box::type(in_stack_00000008,0);
  if (CVar2 == NODE) {
    local_380 = &stack0x00000040;
    pBVar3 = in_stack_00000008;
    memcpy(local_5b0,local_3d8,0x3c);
    ncomp_00 = (int)((ulong)pBVar3 >> 0x20);
    memcpy(auStack_570,local_420,0x3c);
    memcpy(auStack_530,&local_4a0,0x3c);
    local_4f0 = *in_stack_00000010;
    local_4e8 = *(undefined4 *)(in_stack_00000010 + 1);
    LoopConcurrentOnCpu<amrex::FaceLinear::interp_face(amrex::FArrayBox_const&,int,amrex::FArrayBox&,int,int,amrex::Box_const&,amrex::IntVect_const&,amrex::IArrayBox_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,amrex::RunOn)::__0>
              ((Box *)CONCAT44(local_3d0,in_stack_fffffffffffff7a8),ncomp_00,
               (anon_class_208_4_47071d10 *)
               CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
    in_stack_fffffffffffff7ac = local_3d0;
  }
  else {
    CVar2 = Box::type(in_stack_00000008,1);
    if (CVar2 == NODE) {
      local_388 = &stack0x00000040;
      memcpy(local_680,local_3d8,0x3c);
      memcpy(auStack_640,local_420,0x3c);
      memcpy(auStack_600,&local_4a0,0x3c);
      local_5c0 = *in_stack_00000010;
      local_5b8 = *(undefined4 *)(in_stack_00000010 + 1);
      LoopConcurrentOnCpu<amrex::FaceLinear::interp_face(amrex::FArrayBox_const&,int,amrex::FArrayBox&,int,int,amrex::Box_const&,amrex::IntVect_const&,amrex::IArrayBox_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,amrex::RunOn)::__1>
                ((Box *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),ncomp_00,
                 (anon_class_208_4_47071d10 *)CONCAT44(local_3d0,in_stack_fffffffffffff798));
      in_stack_fffffffffffff79c = local_3d0;
    }
    else {
      local_390 = &stack0x00000040;
      memcpy(local_750,local_3d8,0x3c);
      memcpy(auStack_710,local_420,0x3c);
      memcpy(auStack_6d0,&local_4a0,0x3c);
      local_690 = *in_stack_00000010;
      local_688 = *(undefined4 *)(in_stack_00000010 + 1);
      LoopConcurrentOnCpu<amrex::FaceLinear::interp_face(amrex::FArrayBox_const&,int,amrex::FArrayBox&,int,int,amrex::Box_const&,amrex::IntVect_const&,amrex::IArrayBox_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,amrex::RunOn)::__2>
                ((Box *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),ncomp_00,
                 (anon_class_208_4_47071d10 *)
                 CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
    }
  }
  CVar2 = Box::type(in_stack_00000008,0);
  if (CVar2 == NODE) {
    local_398 = &stack0x00000040;
    memcpy(local_7a0,local_3d8,0x3c);
    local_760 = *in_stack_00000010;
    local_758 = *(undefined4 *)(in_stack_00000010 + 1);
    LoopConcurrentOnCpu<amrex::FaceLinear::interp_face(amrex::FArrayBox_const&,int,amrex::FArrayBox&,int,int,amrex::Box_const&,amrex::IntVect_const&,amrex::IArrayBox_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,amrex::RunOn)::__3>
              ((Box *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),ncomp_00,
               (anon_class_80_2_78fa95ee *)
               CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
  }
  else {
    CVar2 = Box::type(in_stack_00000008,1);
    if (CVar2 == NODE) {
      local_3a0 = &stack0x00000040;
      memcpy(local_7f0,local_3d8,0x3c);
      local_7b0 = *in_stack_00000010;
      local_7a8 = *(undefined4 *)(in_stack_00000010 + 1);
      LoopConcurrentOnCpu<amrex::FaceLinear::interp_face(amrex::FArrayBox_const&,int,amrex::FArrayBox&,int,int,amrex::Box_const&,amrex::IntVect_const&,amrex::IArrayBox_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,amrex::RunOn)::__4>
                ((Box *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),ncomp_00,
                 (anon_class_80_2_78fa95ee *)
                 CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
    }
    else {
      local_3a8 = &stack0x00000040;
      memcpy(local_840,local_3d8,0x3c);
      local_800 = *in_stack_00000010;
      local_7f8 = *(undefined4 *)(in_stack_00000010 + 1);
      LoopConcurrentOnCpu<amrex::FaceLinear::interp_face(amrex::FArrayBox_const&,int,amrex::FArrayBox&,int,int,amrex::Box_const&,amrex::IntVect_const&,amrex::IArrayBox_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,amrex::RunOn)::__5>
                ((Box *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),ncomp_00,
                 (anon_class_80_2_78fa95ee *)
                 CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
    }
  }
  return;
}

Assistant:

void
FaceLinear::interp_face (const FArrayBox&  crse,
                         const int         crse_comp,
                         FArrayBox&        fine,
                         const int         fine_comp,
                         const int         ncomp,
                         const Box&        fine_region,
                         const IntVect&    ratio,
                         const IArrayBox&  solve_mask,
                         const Geometry& /*crse_geom */,
                         const Geometry& /*fine_geom */,
                         Vector<BCRec> const& /*bcr*/,
                         const int         /*bccomp*/,
                         RunOn             runon)
{
    BL_PROFILE("FaceLinear::interp_face()");

    AMREX_ASSERT(AMREX_D_TERM(fine_region.type(0),+fine_region.type(1),+fine_region.type(2)) == 1);

    Array4<Real> const& fine_arr = fine.array(fine_comp);
    Array4<Real const> const& crse_arr = crse.const_array(crse_comp);
    Array4<const int> mask_arr;
    if (solve_mask.isAllocated()) {
        mask_arr = solve_mask.const_array();
    }

    //
    // Fill fine ghost faces with piecewise-constant interpolation of coarse data.
    // Operate only on faces that overlap--ie, only fill the fine faces that make up each
    // coarse face, leave the in-between faces alone.
    // The mask ensures we do not overwrite valid fine cells.
    //
    if (fine_region.type(0) == IndexType::NODE)
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_face_interp_x(i,j,k,n,fine_arr,crse_arr,mask_arr,ratio);
        });
    }
#if (AMREX_SPACEDIM >= 2)
    else if (fine_region.type(1) == IndexType::NODE)
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_face_interp_y(i,j,k,n,fine_arr,crse_arr,mask_arr,ratio);
        });
    }
#if (AMREX_SPACEDIM == 3)
    else
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_face_interp_z(i,j,k,n,fine_arr,crse_arr,mask_arr,ratio);
        });
    }
#endif
#endif

    //
    // Interpolate unfilled grow cells using best data from
    // surrounding faces of valid region, and pc-interpd data
    // on fine faces overlaying coarse edges.
    //
    if (fine_region.type(0) == IndexType::NODE)
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_interp_x(i,j,k,n,fine_arr,ratio);
        });
    }
#if (AMREX_SPACEDIM >= 2)
    else if (fine_region.type(1) == IndexType::NODE)
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_interp_y(i,j,k,n,fine_arr,ratio);
        });
    }
#if (AMREX_SPACEDIM == 3)
    else
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_interp_z(i,j,k,n,fine_arr,ratio);
        });
    }
#endif
#endif
}